

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char ** bc_str_split(char *str,char c,size_t max_pieces)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  long local_48;
  size_t count;
  size_t start;
  size_t i;
  char **rv;
  size_t max_pieces_local;
  char c_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    i = (size_t)bc_malloc(8);
    count = 0;
    local_48 = 0;
    start = 0;
    while ((sVar2 = strlen(str), start < sVar2 + 1 && (*str != '\0'))) {
      if (((str[start] == c) && ((max_pieces == 0 || (local_48 + 1U < max_pieces)))) ||
         (str[start] == '\0')) {
        i = (size_t)bc_realloc((void *)i,(local_48 + 1) * 8);
        pvVar3 = bc_malloc((start - count) + 1);
        *(void **)(i + local_48 * 8) = pvVar3;
        memcpy(*(void **)(i + local_48 * 8),str + count,start - count);
        *(undefined1 *)(*(long *)(i + local_48 * 8) + (start - count)) = 0;
        count = start + 1;
        local_48 = local_48 + 1;
      }
      start = start + 1;
    }
    str_local = (char *)bc_realloc((void *)i,(local_48 + 1) * 8);
    pcVar1 = str_local + local_48 * 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  return (char **)str_local;
}

Assistant:

char**
bc_str_split(const char *str, char c, size_t max_pieces)
{
    if (str == NULL)
        return NULL;
    char **rv = bc_malloc(sizeof(char*));
    size_t i, start = 0, count = 0;
    for (i = 0; i < strlen(str) + 1; i++) {
        if (str[0] == '\0')
            break;
        if ((str[i] == c && (!max_pieces || count + 1 < max_pieces)) || str[i] == '\0') {
            rv = bc_realloc(rv, (count + 1) * sizeof(char*));
            rv[count] = bc_malloc(i - start + 1);
            memcpy(rv[count], str + start, i - start);
            rv[count++][i - start] = '\0';
            start = i + 1;
        }
    }
    rv = bc_realloc(rv, (count + 1) * sizeof(char*));
    rv[count] = NULL;
    return rv;
}